

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

uint32_t ly_ctx_get_modules_hash(ly_ctx *ctx)

{
  lysc_node *__s;
  lyd_node_inner *__s_00;
  char *__s_01;
  uint32_t uVar1;
  size_t sVar2;
  lysp_feature *last;
  ulong uVar3;
  uint uVar4;
  lyd_node *plVar5;
  uint32_t local_3c;
  ly_ctx *local_38;
  
  if (ctx == (ly_ctx *)0x0) {
    uVar1 = 0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_get_modules_hash");
  }
  else {
    uVar4 = (uint)((ctx->flags & 4) == 0) * 2 + 6;
    local_3c = 0;
    uVar1 = 0;
    if ((uVar4 < (ctx->list).count) &&
       (plVar5 = (ctx->list).field_2.dnodes[uVar4], plVar5 != (lyd_node *)0x0)) {
      uVar4 = uVar4 | 1;
      uVar1 = 0;
      local_38 = ctx;
      do {
        __s = plVar5->schema;
        sVar2 = strlen((char *)__s);
        uVar1 = lyht_hash_multi(uVar1,(char *)__s,sVar2);
        __s_00 = plVar5->parent;
        if (__s_00 != (lyd_node_inner *)0x0) {
          sVar2 = strlen((char *)__s_00);
          uVar1 = lyht_hash_multi(uVar1,(char *)__s_00,sVar2);
        }
        for (last = lysp_feature_next((lysp_feature *)0x0,(lysp_module *)plVar5[1].next,&local_3c);
            last != (lysp_feature *)0x0;
            last = lysp_feature_next(last,(lysp_module *)plVar5[1].next,&local_3c)) {
          if ((last->flags & 0x20) != 0) {
            __s_01 = last->name;
            sVar2 = strlen(__s_01);
            uVar1 = lyht_hash_multi(uVar1,__s_01,sVar2);
          }
        }
        uVar1 = lyht_hash_multi(uVar1,(char *)&plVar5[2].schema,1);
        if ((local_38->list).count <= uVar4) break;
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        plVar5 = (local_38->list).field_2.dnodes[uVar3];
      } while (plVar5 != (lyd_node *)0x0);
    }
    uVar1 = lyht_hash_multi(uVar1,(char *)0x0,0);
  }
  return uVar1;
}

Assistant:

LIBYANG_API_DEF uint32_t
ly_ctx_get_modules_hash(const struct ly_ctx *ctx)
{
    const struct lys_module *mod;
    uint32_t i = ly_ctx_internal_modules_count(ctx), hash = 0, fi = 0;
    struct lysp_feature *f = NULL;

    LY_CHECK_ARG_RET(ctx, ctx, 0);

    while ((mod = ly_ctx_get_module_iter(ctx, &i))) {
        /* name */
        hash = lyht_hash_multi(hash, mod->name, strlen(mod->name));

        /* revision */
        if (mod->revision) {
            hash = lyht_hash_multi(hash, mod->revision, strlen(mod->revision));
        }

        /* enabled features */
        while ((f = lysp_feature_next(f, mod->parsed, &fi))) {
            if (f->flags & LYS_FENABLED) {
                hash = lyht_hash_multi(hash, f->name, strlen(f->name));
            }
        }

        /* imported/implemented */
        hash = lyht_hash_multi(hash, (char *)&mod->implemented, sizeof mod->implemented);
    }

    hash = lyht_hash_multi(hash, NULL, 0);
    return hash;
}